

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

int verify_picnic3(signature2_t *sig,uint8_t *pubKey,uint8_t *plaintext,uint8_t *message,
                  size_t messageByteLength,picnic_instance_t *params)

{
  _Bool _Var1;
  int iVar2;
  picnic_instance_t *params_00;
  uint uVar3;
  uint8_t *in_RSI;
  long in_RDI;
  picnic_instance_t *in_R9;
  picnic_instance_t *in_stack_00000038;
  commitments_t *in_stack_00000040;
  picnic_instance_t *in_stack_00000048;
  size_t in_stack_00000050;
  uint8_t *in_stack_00000058;
  uint8_t **in_stack_00000060;
  size_t t_3;
  uint8_t challenge [64];
  uint16_t *missingLeaves;
  size_t missingLeavesSize;
  uint8_t *input;
  int unopened_1;
  uint16_t t_2;
  uint8_t i;
  uint16_t t_1;
  size_t t4;
  uint8_t *seed_ptr_1 [4];
  size_t j_1;
  size_t unopened;
  uint8_t *seed_ptr [4];
  size_t j;
  uint16_t hideList [1];
  tree_t seed;
  uint16_t t;
  lowmc_simulate_online_f simulateOnline;
  size_t last;
  mzd_local_t m_maskedKey [1];
  mzd_local_t m_plaintext [1];
  commitments_t Cv;
  commitments_t Ch;
  tree_t iSeedsTree;
  randomTape_t *tapes;
  uint16_t *challengeP;
  uint16_t *challengeC;
  size_t challengeSizeBytes;
  tree_t treeCv;
  msgs_t *msgs;
  commitments_t C [4];
  int ret;
  ulong in_stack_fffffffffffffd00;
  picnic_instance_t *repIndex;
  undefined4 uVar4;
  size_t in_stack_fffffffffffffd08;
  picnic_instance_t *params_01;
  tree_t *in_stack_fffffffffffffd10;
  commitments_t *in_stack_fffffffffffffd18;
  tree_t *in_stack_fffffffffffffd20;
  picnic_instance_t *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  randomTape_t *in_stack_fffffffffffffd38;
  uint16_t *in_stack_fffffffffffffd40;
  tree_t *in_stack_fffffffffffffd48;
  uint8_t *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd64;
  ulong local_298;
  undefined1 local_290 [64];
  uint16_t *local_250;
  long local_248;
  undefined8 local_240;
  uint local_234;
  ushort local_22e;
  byte local_22b;
  uint16_t local_22a;
  long local_228;
  uint8_t *in_stack_fffffffffffffde0;
  picnic_instance_t *in_stack_fffffffffffffde8;
  commitments_t *in_stack_fffffffffffffdf0;
  msgs_t *in_stack_fffffffffffffdf8;
  uint16_t *in_stack_fffffffffffffe00;
  uint8_t *in_stack_fffffffffffffe08;
  picnic_instance_t *in_stack_fffffffffffffe18;
  uint8_t *in_stack_fffffffffffffe20;
  uint8_t *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  picnic_instance_t *in_stack_fffffffffffffe38;
  tree_t local_1b8;
  uint16_t local_192;
  lowmc_simulate_online_f local_190;
  uint8_t *local_188;
  mzd_local_t local_180;
  mzd_local_t local_160;
  long local_128;
  tree_t local_108;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  size_t local_d0;
  msgs_t *local_a8;
  long local_a0 [9];
  int local_54;
  picnic_instance_t *local_50;
  uint8_t *local_30;
  long local_28;
  
  local_54 = -1;
  local_50 = in_R9;
  local_30 = in_RSI;
  local_28 = in_RDI;
  allocateCommitments2
            (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  allocateCommitments2
            (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  allocateCommitments2
            (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  allocateCommitments2
            (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  local_a8 = allocateMsgsVerify((picnic_instance_t *)in_stack_fffffffffffffd10);
  if (local_a8 != (msgs_t *)0x0) {
    _Var1 = createTree(in_stack_fffffffffffffd10,(uint)(in_stack_fffffffffffffd08 >> 0x20),
                       (uint)in_stack_fffffffffffffd08);
    if (_Var1) {
      local_d0 = (ulong)local_50->num_opened_rounds << 1;
      local_d8 = malloc(local_d0);
      local_e0 = malloc(local_d0);
      local_e8 = malloc((ulong)local_50->num_rounds * 0x98);
      if ((((local_d8 != (void *)0x0) && (local_e0 != (void *)0x0)) && (local_e8 != (void *)0x0)) &&
         (_Var1 = createTree(in_stack_fffffffffffffd10,(uint)(in_stack_fffffffffffffd08 >> 0x20),
                             (uint)in_stack_fffffffffffffd08), _Var1)) {
        repIndex = (picnic_instance_t *)(in_stack_fffffffffffffd00 & 0xffffffff00000000);
        params_01 = local_50;
        local_54 = reconstructSeeds(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                                    (size_t)in_stack_fffffffffffffd38,
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    (size_t)in_stack_fffffffffffffd28,
                                    (uint8_t *)in_stack_fffffffffffffd20,
                                    (uint)in_stack_fffffffffffffd58,
                                    (picnic_instance_t *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        if (local_54 == 0) {
          allocateCommitments2
                    (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
                     (size_t)params_01);
          allocateCommitments2
                    (in_stack_fffffffffffffd18,(picnic_instance_t *)in_stack_fffffffffffffd10,
                     (size_t)params_01);
          mzd_from_char_array((mzd_local_t *)in_stack_fffffffffffffd38,
                              (uint8_t *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              (size_t)in_stack_fffffffffffffd28);
          local_188 = (uint8_t *)(long)(int)(local_50->num_MPC_parties - 1);
          local_190 = lowmc_simulate_online_get_implementation
                                ((lowmc_parameters_t *)in_stack_fffffffffffffd10);
          for (local_192 = 0; local_192 < local_50->num_rounds; local_192 = local_192 + 1) {
            iVar2 = contains(*(uint16_t **)(local_28 + 0x48),(ulong)local_50->num_opened_rounds,
                             local_192);
            if (iVar2 == 0) {
              in_stack_fffffffffffffd64 = (uint)local_50->num_MPC_parties;
              getLeaf(&local_108,(uint)local_192);
              _Var1 = generateSeeds(in_stack_fffffffffffffd20,
                                    (uint)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                                    (uint8_t *)in_stack_fffffffffffffd10,(uint8_t *)params_01,
                                    (size_t)repIndex,(picnic_instance_t *)0x13f729);
              if (!_Var1) {
                local_54 = -1;
                goto LAB_00140314;
              }
            }
            else {
              _Var1 = createTree(in_stack_fffffffffffffd10,(uint)((ulong)params_01 >> 0x20),
                                 (uint)params_01);
              uVar4 = (undefined4)((ulong)repIndex >> 0x20);
              if (!_Var1) {
                local_54 = -1;
                goto LAB_00140314;
              }
              in_stack_fffffffffffffd58 = *(uint8_t **)(local_28 + 0x50);
              indexOf(*(uint16_t **)(local_28 + 0x48),(ulong)local_50->num_opened_rounds,local_192);
              repIndex = (picnic_instance_t *)CONCAT44(uVar4,(uint)local_192);
              params_01 = local_50;
              local_54 = reconstructSeeds(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                                          (size_t)in_stack_fffffffffffffd38,
                                          (uint8_t *)
                                          CONCAT44(in_stack_fffffffffffffd34,
                                                   in_stack_fffffffffffffd30),
                                          (size_t)in_stack_fffffffffffffd28,
                                          (uint8_t *)in_stack_fffffffffffffd20,
                                          (uint)in_stack_fffffffffffffd58,
                                          (picnic_instance_t *)
                                          CONCAT44(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60));
              if (local_54 != 0) {
                clearTree((tree_t *)0x13f860);
                local_54 = -1;
                goto LAB_00140314;
              }
              local_54 = 0;
            }
            params_00 = (picnic_instance_t *)((long)local_e8 + (ulong)local_192 * 0x98);
            getLeaves(&local_1b8);
            createRandomTapes((randomTape_t *)t_3,(uint8_t *)in_stack_00000060,in_stack_00000058,
                              in_stack_00000050,in_stack_00000048);
            iVar2 = contains(*(uint16_t **)(local_28 + 0x48),(ulong)local_50->num_opened_rounds,
                             local_192);
            if (iVar2 == 0) {
              computeAuxTape((randomTape_t *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                             in_stack_fffffffffffffd58,params_00);
              for (in_stack_fffffffffffffe38 = (picnic_instance_t *)0x0;
                  in_stack_fffffffffffffe38 < (picnic_instance_t *)(ulong)local_50->num_MPC_parties;
                  in_stack_fffffffffffffe38 =
                       (picnic_instance_t *)&in_stack_fffffffffffffe38->num_rounds) {
                getLeaf(&local_1b8,(uint)in_stack_fffffffffffffe38);
                in_stack_fffffffffffffe18 =
                     (picnic_instance_t *)getLeaf(&local_1b8,(int)in_stack_fffffffffffffe38 + 1);
                in_stack_fffffffffffffe20 = getLeaf(&local_1b8,(int)in_stack_fffffffffffffe38 + 2);
                in_stack_fffffffffffffe28 = getLeaf(&local_1b8,(int)in_stack_fffffffffffffe38 + 3);
                commit_x4((uint8_t **)t_3,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                          (size_t)in_stack_00000048,(picnic_instance_t *)in_stack_00000040);
              }
              in_stack_fffffffffffffd48 =
                   *(tree_t **)
                    (local_a0[(long)(int)((uint)local_192 % 4) * 2] + (long)local_188 * 8);
              getLeaf(&local_1b8,(uint)local_188);
              repIndex = local_50;
              commit(in_stack_fffffffffffffe08,(uint8_t *)in_stack_fffffffffffffe00,
                     (uint8_t *)in_stack_fffffffffffffdf8,(uint8_t *)in_stack_fffffffffffffdf0,
                     (size_t)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0,
                     in_stack_fffffffffffffe18);
            }
            else {
              in_stack_fffffffffffffd40 = *(uint16_t **)(local_28 + 0x50);
              iVar2 = indexOf(*(uint16_t **)(local_28 + 0x48),(ulong)local_50->num_opened_rounds,
                              local_192);
              in_stack_fffffffffffffe08 = (uint8_t *)(ulong)in_stack_fffffffffffffd40[iVar2];
              for (in_stack_fffffffffffffe00 = (uint16_t *)0x0;
                  in_stack_fffffffffffffe00 < (uint16_t *)(ulong)local_50->num_MPC_parties;
                  in_stack_fffffffffffffe00 = in_stack_fffffffffffffe00 + 2) {
                in_stack_fffffffffffffde0 = getLeaf(&local_1b8,(uint)in_stack_fffffffffffffe00);
                in_stack_fffffffffffffde8 =
                     (picnic_instance_t *)getLeaf(&local_1b8,(int)in_stack_fffffffffffffe00 + 1);
                in_stack_fffffffffffffdf0 =
                     (commitments_t *)getLeaf(&local_1b8,(int)in_stack_fffffffffffffe00 + 2);
                in_stack_fffffffffffffdf8 =
                     (msgs_t *)getLeaf(&local_1b8,(int)in_stack_fffffffffffffe00 + 3);
                commit_x4((uint8_t **)t_3,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                          (size_t)in_stack_00000048,(picnic_instance_t *)in_stack_00000040);
              }
              if (local_188 != in_stack_fffffffffffffe08) {
                in_stack_fffffffffffffd38 =
                     *(randomTape_t **)
                      (local_a0[(long)(int)((uint)local_192 % 4) * 2] + (long)local_188 * 8);
                getLeaf(&local_1b8,(uint)local_188);
                repIndex = local_50;
                commit(in_stack_fffffffffffffe08,(uint8_t *)in_stack_fffffffffffffe00,
                       (uint8_t *)in_stack_fffffffffffffdf8,(uint8_t *)in_stack_fffffffffffffdf0,
                       (size_t)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0,
                       in_stack_fffffffffffffe18);
              }
              memcpy(*(void **)(local_a0[(long)(int)((uint)local_192 % 4) * 2] +
                               (long)in_stack_fffffffffffffe08 * 8),
                     *(void **)(*(long *)(local_28 + 0x58) + (ulong)local_192 * 0x38 + 0x18),
                     (ulong)local_50->digest_size);
            }
            in_stack_fffffffffffffd34 = (uint)local_192;
            uVar3 = local_50->num_rounds / 4;
            if (SBORROW4(in_stack_fffffffffffffd34,uVar3 * 4) ==
                (int)(in_stack_fffffffffffffd34 + uVar3 * -4) < 0) {
              commit_h((uint8_t *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                       in_stack_fffffffffffffde8);
            }
            else if ((local_192 + 1) % 4 == 0) {
              local_228 = (long)(int)(local_192 / 4 << 2);
              commit_h_x4((uint8_t **)in_stack_00000048,in_stack_00000040,in_stack_00000038);
            }
            clearTree((tree_t *)0x13fe72);
          }
          for (local_22a = 0; local_22a < local_50->num_rounds; local_22a = local_22a + 1) {
            iVar2 = contains(*(uint16_t **)(local_28 + 0x48),(ulong)local_50->num_opened_rounds,
                             local_22a);
            if (iVar2 == 0) {
              *(undefined8 *)(local_128 + (ulong)local_22a * 8) = 0;
            }
          }
          for (local_22b = 0; local_22b < local_50->num_opened_rounds; local_22b = local_22b + 1) {
            local_22e = *(ushort *)(*(long *)(local_28 + 0x48) + (ulong)local_22b * 2);
            local_234 = (uint)*(ushort *)(*(long *)(local_28 + 0x50) + (ulong)local_22b * 2);
            local_240 = *(undefined8 *)(*(long *)(local_28 + 0x58) + (ulong)local_22e * 0x38 + 0x20)
            ;
            setAuxBits(in_stack_fffffffffffffd38,
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd28);
            memset(*(void **)((long)local_e8 + (long)(int)local_234 * 8 + (ulong)local_22e * 0x98),0
                   ,(long)(int)((uint)local_50->view_size << 1));
            memcpy(local_a8->msgs[(int)local_234],
                   *(void **)(*(long *)(local_28 + 0x58) + (ulong)local_22e * 0x38 + 0x28),
                   (ulong)local_50->view_size);
            mzd_from_char_array((mzd_local_t *)in_stack_fffffffffffffd38,
                                (uint8_t *)
                                CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                (size_t)in_stack_fffffffffffffd28);
            local_a8->unopened = local_234;
            local_a8->pos = 0;
            local_54 = (*local_190)(&local_180,
                                    (randomTape_t *)((long)local_e8 + (ulong)local_22e * 0x98),
                                    local_a8,&local_160,local_30,local_50);
            if (local_54 != 0) {
              local_54 = -1;
              goto LAB_00140314;
            }
            commit_v(in_stack_fffffffffffffe08,(uint8_t *)in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdf8,(picnic_instance_t *)in_stack_fffffffffffffdf0);
          }
          local_248 = (long)(int)((uint)local_50->num_rounds - (uint)local_50->num_opened_rounds);
          local_250 = getMissingLeavesList
                                ((uint16_t *)in_stack_fffffffffffffd28,
                                 (picnic_instance_t *)in_stack_fffffffffffffd20);
          local_54 = addMerkleNodes((tree_t *)in_stack_fffffffffffffd38,
                                    (uint16_t *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    (size_t)in_stack_fffffffffffffd28,
                                    (uint8_t *)in_stack_fffffffffffffd20,
                                    (size_t)in_stack_fffffffffffffd18);
          free(local_250);
          if (local_54 == 0) {
            local_54 = verifyMerkleTree(in_stack_fffffffffffffd20,
                                        (uint8_t **)in_stack_fffffffffffffd18,
                                        (uint8_t *)in_stack_fffffffffffffd10,params_01);
            if (local_54 == 0) {
              HCP(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                  (uint16_t *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                  (uint8_t *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                  (uint8_t *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                  in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
              local_54 = memcmp(*(void **)(local_28 + 0x40),local_290,(ulong)local_50->digest_size);
              if (local_54 != 0) {
                local_54 = -1;
              }
            }
            else {
              local_54 = -1;
            }
          }
          else {
            local_54 = -1;
          }
LAB_00140314:
          for (local_298 = 0; local_298 < local_50->num_rounds; local_298 = local_298 + 1) {
            freeRandomTape((randomTape_t *)0x14034c);
          }
          freeCommitments2((commitments_t *)0x140369);
          freeCommitments2((commitments_t *)0x140376);
        }
        else {
          local_54 = -1;
        }
        clearTree((tree_t *)0x140383);
      }
      free(local_e8);
      free(local_e0);
      free(local_d8);
      clearTree((tree_t *)0x1403b7);
    }
    freeMsgs((msgs_t *)0x1403c4);
  }
  freeCommitments2((commitments_t *)0x1403d5);
  freeCommitments2((commitments_t *)0x1403e6);
  freeCommitments2((commitments_t *)0x1403f7);
  freeCommitments2((commitments_t *)0x140404);
  return local_54;
}

Assistant:

static int verify_picnic3(signature2_t* sig, const uint8_t* pubKey, const uint8_t* plaintext,
                          const uint8_t* message, size_t messageByteLength,
                          const picnic_instance_t* params) {
  int ret = -1;

  commitments_t C[4];
  allocateCommitments2(&C[0], params, params->num_MPC_parties);
  allocateCommitments2(&C[1], params, params->num_MPC_parties);
  allocateCommitments2(&C[2], params, params->num_MPC_parties);
  allocateCommitments2(&C[3], params, params->num_MPC_parties);

  msgs_t* msgs = allocateMsgsVerify(params);
  if (!msgs) {
    goto free_commitmentsC;
  }

  tree_t treeCv;
  if (!createTree(&treeCv, params->num_rounds, params->digest_size)) {
    goto free_msgs;
  }

  const size_t challengeSizeBytes = params->num_opened_rounds * sizeof(uint16_t);
  uint16_t* challengeC            = malloc(challengeSizeBytes);
  uint16_t* challengeP            = malloc(challengeSizeBytes);
  randomTape_t* tapes             = malloc(params->num_rounds * sizeof(randomTape_t));
  if (!challengeC || !challengeP || !tapes) {
    goto free_tapes;
  }

  tree_t iSeedsTree;
  if (!createTree(&iSeedsTree, params->num_rounds, params->seed_size)) {
    goto free_tapes;
  }

  ret = reconstructSeeds(&iSeedsTree, sig->challengeC, params->num_opened_rounds, sig->iSeedInfo,
                         sig->iSeedInfoLen, sig->salt, 0, params);
  if (ret) {
    ret = -1;
    goto free_seedstree;
  }

  commitments_t Ch;
  allocateCommitments2(&Ch, params, params->num_rounds);
  commitments_t Cv;
  allocateCommitments2(&Cv, params, params->num_rounds);
  mzd_local_t m_plaintext[1];
  mzd_local_t m_maskedKey[1];
  mzd_from_char_array(m_plaintext, plaintext, params->input_output_size);

  const size_t last                      = params->num_MPC_parties - 1;
  lowmc_simulate_online_f simulateOnline = lowmc_simulate_online_get_implementation(&params->lowmc);

  /* Populate seeds with values from the signature */
  for (uint16_t t = 0; t < params->num_rounds; t++) {
    tree_t seed;
    if (!contains(sig->challengeC, params->num_opened_rounds, t)) {
      /* Expand iSeed[t] to seeds for each parties, using a seed tree */
      if (!generateSeeds(&seed, params->num_MPC_parties, getLeaf(&iSeedsTree, t), sig->salt, t,
                         params)) {
        ret = -1;
        goto Exit;
      }
    } else {
      /* We don't have the initial seed for the round, but instead a seed
       * for each unopened party */
      if (!createTree(&seed, params->num_MPC_parties, params->seed_size)) {
        ret = -1;
        goto Exit;
      }

      uint16_t hideList[1] = {
          sig->challengeP[indexOf(sig->challengeC, params->num_opened_rounds, t)]};
      ret = reconstructSeeds(&seed, hideList, 1, sig->proofs[t].seedInfo,
                             sig->proofs[t].seedInfoLen, sig->salt, t, params);
      if (ret != 0) {
#if !defined(NDEBUG)
        printf("Failed to reconstruct seeds for round %" PRIu16 "\n", t);
#endif
        clearTree(&seed);
        ret = -1;
        goto Exit;
      }
    }
    /* Commit */

    /* Compute random tapes for all parties.  One party for each repetition
     * challengeC will have a bogus seed; but we won't use that party's
     * random tape. */
    createRandomTapes(&tapes[t], getLeaves(&seed), sig->salt, t, params);

    if (!contains(sig->challengeC, params->num_opened_rounds, t)) {
      /* We're given iSeed, have expanded the seeds, compute aux from scratch so we can compute
       * Com[t] */
      computeAuxTape(&tapes[t], NULL, params);
      for (size_t j = 0; j < params->num_MPC_parties; j += 4) {
        const uint8_t* seed_ptr[4] = {getLeaf(&seed, j + 0), getLeaf(&seed, j + 1),
                                      getLeaf(&seed, j + 2), getLeaf(&seed, j + 3)};
        commit_x4(C[t % 4].hashes + j, seed_ptr, sig->salt, t, j, params);
      }
      commit(C[t % 4].hashes[last], getLeaf(&seed, last), tapes[t].aux_bits, sig->salt, t, last,
             params);
      /* after we have checked the tape, we do not need it anymore for this opened iteration */
    } else {
      /* We're given all seeds and aux bits, except for the unopened
       * party, we get their commitment */
      size_t unopened = sig->challengeP[indexOf(sig->challengeC, params->num_opened_rounds, t)];
      for (size_t j = 0; j < params->num_MPC_parties; j += 4) {
        const uint8_t* seed_ptr[4] = {getLeaf(&seed, j + 0), getLeaf(&seed, j + 1),
                                      getLeaf(&seed, j + 2), getLeaf(&seed, j + 3)};
        commit_x4(C[t % 4].hashes + j, seed_ptr, sig->salt, t, j, params);
      }
      if (last != unopened) {
        commit(C[t % 4].hashes[last], getLeaf(&seed, last), sig->proofs[t].aux, sig->salt, t, last,
               params);
      }

      memcpy(C[t % 4].hashes[unopened], sig->proofs[t].C, params->digest_size);
    }
    /* hash commitments every four iterations if possible, for the last few do single commitments
     */
    if (t >= params->num_rounds / 4 * 4) {
      commit_h(Ch.hashes[t], &C[t % 4], params);
    } else if ((t + 1) % 4 == 0) {
      size_t t4 = t / 4 * 4;
      commit_h_x4(&Ch.hashes[t4], &C[0], params);
    }
    clearTree(&seed);
  }

  /* Commit to the views */
  for (uint16_t t = 0; t < params->num_rounds; t++) {
    if (!contains(sig->challengeC, params->num_opened_rounds, t)) {
      Cv.hashes[t] = NULL;
    }
  }

  for (uint8_t i = 0; i < params->num_opened_rounds; i++) {
    /* 2. When t is in C, we have everything we need to re-compute the view, as an honest signer
     * would.
     * We simulate the MPC with one fewer party; the unopened party's values are all set to zero.
     */
    uint16_t t     = sig->challengeC[i];
    int unopened   = sig->challengeP[i];
    uint8_t* input = sig->proofs[t].input;
    setAuxBits(&tapes[t], sig->proofs[t].aux, params);
    memset(tapes[t].tape[unopened], 0, 2 * params->view_size);
    memcpy(msgs->msgs[unopened], sig->proofs[t].msgs, params->view_size);
    mzd_from_char_array(m_maskedKey, input, params->input_output_size);
    msgs->unopened = unopened;
    msgs->pos      = 0;
    ret            = simulateOnline(m_maskedKey, &tapes[t], msgs, m_plaintext, pubKey, params);

    if (ret != 0) {
#if !defined(NDEBUG)
      printf("MPC simulation failed for round %" PRIu8 ", signature invalid\n", i);
#endif
      ret = -1;
      goto Exit;
    }
    commit_v(Cv.hashes[t], sig->proofs[t].input, msgs, params);
  }

  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = getMissingLeavesList(sig->challengeC, params);
  ret = addMerkleNodes(&treeCv, missingLeaves, missingLeavesSize, sig->cvInfo, sig->cvInfoLen);
  free(missingLeaves);
  if (ret != 0) {
    ret = -1;
    goto Exit;
  }

  ret = verifyMerkleTree(&treeCv, Cv.hashes, sig->salt, params);
  if (ret != 0) {
    ret = -1;
    goto Exit;
  }

  /* Compute the challenge; two lists of integers */
  uint8_t challenge[MAX_DIGEST_SIZE];
  HCP(challenge, challengeC, challengeP, &Ch, treeCv.nodes, sig->salt, pubKey, plaintext, message,
      messageByteLength, params);

  /* Compare to challenge from signature */
  ret = memcmp(sig->challenge, challenge, params->digest_size);
  if (ret) {
#if !defined(NDEBUG)
    printf("Challenge does not match, signature invalid\n");
#endif
    ret = -1;
  }

Exit:
  for (size_t t = 0; t < params->num_rounds; t++) {
    freeRandomTape(&tapes[t]);
  }

  freeCommitments2(&Cv);
  freeCommitments2(&Ch);

free_seedstree:
  clearTree(&iSeedsTree);

free_tapes:
  free(tapes);
  free(challengeP);
  free(challengeC);

  /* free_cvtree: */
  clearTree(&treeCv);

free_msgs:
  freeMsgs(msgs);

free_commitmentsC:
  freeCommitments2(&C[3]);
  freeCommitments2(&C[2]);
  freeCommitments2(&C[1]);
  freeCommitments2(&C[0]);

  return ret;
}